

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetlinecontrol.cpp
# Opt level: O1

void __thiscall QWidgetLineControl::selectWordAtPos(QWidgetLineControl *this,int cursor)

{
  ushort uVar1;
  int *piVar2;
  char cVar3;
  CursorMode pos;
  uint uVar4;
  int iVar5;
  wchar32 wVar6;
  ulong uVar7;
  ulong uVar8;
  
  iVar5 = (int)this + 0x118;
  pos = QTextLayout::previousCursorPosition(iVar5,(uint)(cursor < *(int *)(this + 0x28)) + cursor);
  moveCursor(this,pos,false);
  uVar4 = QTextLayout::nextCursorPosition(iVar5,pos);
  uVar8 = (ulong)uVar4;
  if (cursor < (int)uVar4) {
    uVar7 = (ulong)(int)uVar4;
    do {
      piVar2 = *(int **)(this + 0x18);
      if ((piVar2 == (int *)0x0) || (1 < *piVar2)) {
        QString::reallocData((longlong)(this + 0x18),(AllocationOption)*(undefined8 *)(this + 0x28))
        ;
      }
      uVar1 = *(ushort *)(*(long *)(this + 0x20) + -2 + uVar7 * 2);
    } while ((((uVar1 - 9 < 5) || (uVar1 == 0x20)) ||
             ((uVar8 = uVar7, 0x7f < uVar1 &&
              (((wVar6 = (wchar32)uVar1, wVar6 == L'\x85' || (wVar6 == L'\xa0')) ||
               (cVar3 = QChar::isSpace_helper(wVar6), cVar3 != '\0')))))) &&
            (uVar7 = uVar7 - 1, uVar8 = (ulong)(uint)cursor, (long)cursor < (long)uVar7));
  }
  moveCursor(this,(int)uVar8,true);
  return;
}

Assistant:

void QWidgetLineControl::selectWordAtPos(int cursor)
{
    int next = cursor + 1;
    if (next > end())
        --next;
    int c = textLayout()->previousCursorPosition(next, QTextLayout::SkipWords);
    moveCursor(c, false);
    // ## text layout should support end of words.
    int end = textLayout()->nextCursorPosition(c, QTextLayout::SkipWords);
    while (end > cursor && m_text[end-1].isSpace())
        --end;
    moveCursor(end, true);
}